

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall
CUI::DoEditBoxOption(CUI *this,CLineInput *pLineInput,CUIRect *pRect,char *pStr,float VSplitVal)

{
  undefined8 in_RCX;
  CUIRect *in_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  float fVar1;
  undefined4 unaff_retaddr;
  undefined4 unaff_retaddr_00;
  CUI *in_stack_00000008;
  float FontSize;
  CUIRect EditBox;
  CUIRect Label;
  char aBuf [32];
  CUIRect *pLeft;
  vector4_base<float> *this_00;
  char *buffer;
  char *pText;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar2;
  char local_58 [16];
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  vec4 *in_stack_ffffffffffffffc0;
  CUIRect *in_stack_ffffffffffffffc8;
  char local_28 [16];
  IButtonColorFunction *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  CUIRect *pRect_00;
  
  pRect_00 = *(CUIRect **)(in_FS_OFFSET + 0x28);
  this_00 = (vector4_base<float> *)&stack0xffffffffffffffc8;
  pLeft = in_RDX;
  vector4_base<float>::vector4_base(this_00,0.0,0.0,0.0,0.25);
  fVar1 = (float)((ulong)this_00 >> 0x20);
  uVar2 = 0xf;
  CUIRect::Draw(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                (int)in_stack_ffffffffffffffb8);
  pText = local_58;
  CUIRect::VSplitLeft((CUIRect *)&stack0xffffffffffffffb8,fVar1,pLeft,(CUIRect *)0x1dd5ef);
  fVar1 = in_RDX->h * 0.8 * 0.8;
  buffer = local_28;
  str_format(buffer,0x20,"%s:",in_RCX);
  DoLabel((CUI *)CONCAT44(in_XMM0_Da,fVar1),(CUIRect *)CONCAT44(uVar2,in_stack_ffffffffffffff78),
          pText,(float)((ulong)in_RDI >> 0x20),(int)in_RDI,(float)((ulong)buffer >> 0x20),
          SUB81((ulong)buffer >> 0x18,0));
  DoEditBox(in_stack_00000008,(CLineInput *)CONCAT44(unaff_retaddr_00,unaff_retaddr),pRect_00,
            in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if (*(CUIRect **)(in_FS_OFFSET + 0x28) == pRect_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::DoEditBoxOption(CLineInput *pLineInput, const CUIRect *pRect, const char *pStr, float VSplitVal)
{
	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, EditBox;
	pRect->VSplitLeft(VSplitVal, &Label, &EditBox);

	const float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%s:", pStr);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_MC);

	DoEditBox(pLineInput, &EditBox, FontSize);
}